

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O2

uint32_t event_track::get_meta_segment_bytes
                   (vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                    *in_emsg_list,uint64_t seg_start,uint64_t seg_end,uint32_t track_id,
                   uint32_t timescale,
                   vector<unsigned_char,_std::allocator<unsigned_char>_> *segment_bytes,
                   uint32_t seq_num,bool is_vtt)

{
  int iVar1;
  int iVar2;
  pointer puVar3;
  size_type __n;
  size_type sVar4;
  uint64_t timestamp_tfdt;
  uint64_t next_tfdt;
  uchar local_1d9;
  vector<event_track::EventSample,_std::allocator<event_track::EventSample>_> samples_in_segment;
  stringstream ot;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ot,_S_out|_S_in|_S_bin);
  samples_in_segment.
  super__Vector_base<event_track::EventSample,_std::allocator<event_track::EventSample>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  samples_in_segment.
  super__Vector_base<event_track::EventSample,_std::allocator<event_track::EventSample>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  samples_in_segment.
  super__Vector_base<event_track::EventSample,_std::allocator<event_track::EventSample>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  next_tfdt = (uint64_t)is_vtt;
  find_event_samples(in_emsg_list,&samples_in_segment,seg_start,seg_end,is_vtt);
  write_evt_samples_as_fmp4_fragment
            (&samples_in_segment,local_1a8,timestamp_tfdt,track_id,next_tfdt,seq_num);
  std::istream::seekg((long)&ot,_S_beg);
  __n = std::istream::tellg();
  std::istream::seekg((long)&ot,_S_beg);
  puVar3 = (segment_bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((segment_bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (segment_bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(segment_bytes,__n);
  while( true ) {
    sVar4 = std::istream::tellg();
    if (sVar4 == __n) break;
    local_1d9 = std::istream::get();
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (segment_bytes,&local_1d9);
  }
  iVar1 = *(int *)&(segment_bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
  iVar2 = *(int *)&(segment_bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   )._M_impl.super__Vector_impl_data._M_start;
  std::vector<event_track::EventSample,_std::allocator<event_track::EventSample>_>::~vector
            (&samples_in_segment);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ot);
  return iVar1 - iVar2;
}

Assistant:

uint32_t event_track::get_meta_segment_bytes(
	std::vector<event_track::DASHEventMessageBoxv1>& in_emsg_list,
	uint64_t seg_start,
	uint64_t seg_end,
	uint32_t track_id,
	uint32_t timescale,
	std::vector<uint8_t>& segment_bytes,
	uint32_t seq_num,
    bool is_vtt)
{
	std::stringstream ot(
		std::stringstream::out | \
		std::stringstream::in | \
		std::stringstream::binary\
	);

	std::vector<event_track::EventSample> samples_in_segment;

	find_event_samples(
		in_emsg_list,
		samples_in_segment,
		seg_start,
		seg_end,
		is_vtt
	);

	event_track::write_evt_samples_as_fmp4_fragment(
		samples_in_segment,
		ot,
		seg_start,
		track_id,
		seg_end,
		seq_num
	);

	ot.seekg(0, ot.end);
	uint64_t length = ot.tellg();
	ot.seekg(0, ot.beg);
	segment_bytes.clear();
	segment_bytes.reserve(length);

	char c;
	while (ot.tellg() != length)
	{
		c = ot.get();
		segment_bytes.push_back((uint8_t)c);
	}

	return (uint32_t)segment_bytes.size();
}